

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

void __thiscall lest::got::got(got *this,location *where_,text *expr_,text *excpt_)

{
  allocator local_e9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  char local_d8 [8];
  undefined8 uStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  text local_a8;
  text local_88;
  text local_68;
  location local_48;
  
  std::operator+(&local_c8,"passed: got exception ",excpt_);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
    local_a8.field_2._8_8_ = local_c8.field_2._8_8_;
  }
  else {
    local_a8._M_dataplus._M_p = local_c8._M_dataplus._M_p;
  }
  local_a8._M_string_length = local_c8._M_string_length;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  location::location(&local_48,where_);
  std::__cxx11::string::string((string *)&local_68,(string *)expr_);
  std::__cxx11::string::string((string *)&local_e8,"",&local_e9);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  if (local_e8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8) {
    local_88.field_2._8_8_ = uStack_d0;
  }
  else {
    local_88._M_dataplus._M_p = (pointer)local_e8;
  }
  local_88._M_string_length = local_e0;
  local_e0 = 0;
  local_d8[0] = '\0';
  local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_d8;
  success::success(&this->super_success,&local_a8,&local_48,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  *(undefined ***)&(this->super_success).super_message = &PTR__message_001e6d10;
  return;
}

Assistant:

got( location where_, text expr_, text excpt_)
    : success( "passed: got exception " + excpt_, where_, expr_) {}